

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void * phmap::priv::Allocate<4ul,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>
                 (Alloc<phmap::priv::hash_internal::Enum> *alloc,size_t n)

{
  pointer pMVar1;
  void *p;
  A mem_alloc;
  size_t n_local;
  Alloc<phmap::priv::hash_internal::Enum> *alloc_local;
  
  mem_alloc.id_ = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 4UL, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
                 );
  }
  Alloc<M>::Alloc<phmap::priv::hash_internal::Enum>((Alloc<M> *)&p,alloc);
  pMVar1 = allocator_traits<phmap::priv::Alloc<M>_>::allocate((Alloc<M> *)&p,mem_alloc.id_ + 3 >> 2)
  ;
  if (((ulong)pMVar1 & 3) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x1064,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 4UL, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
                 );
  }
  Alloc<M>::~Alloc((Alloc<M> *)&p);
  return pMVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}